

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse-3-implicit-types.cpp
# Opt level: O0

Result<wasm::Ok> *
wasm::WATParser::parseImplicitTypeDefs
          (Result<wasm::Ok> *__return_storage_ptr__,ParseDeclsCtx *decls,Lexer *input,
          IndexMap *typeIndices,vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *types,
          unordered_map<unsigned_int,_wasm::HeapType,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::HeapType>_>_>
          *implicitTypes)

{
  Module *pMVar1;
  bool bVar2;
  reference puVar3;
  ulong uVar4;
  size_type sVar5;
  reference __x;
  pair<std::__detail::_Node_iterator<std::pair<const_wasm::HeapType,_unsigned_int>,_false,_true>,_bool>
  pVar6;
  Ok local_1b1;
  _Node_iterator_base<std::pair<const_wasm::HeapType,_unsigned_int>,_true> local_1b0;
  undefined1 local_1a8;
  pair<const_wasm::HeapType,_unsigned_int> local_1a0;
  uint local_190;
  uint local_18c;
  Index i;
  Err *local_168;
  Err *err;
  Result<wasm::Ok> _val;
  undefined1 local_128 [8];
  WithPosition<wasm::WATParser::ParseImplicitTypeDefsCtx> with;
  iterator iStack_f8;
  Index pos;
  iterator __end2;
  iterator __begin2;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *__range2;
  ParseImplicitTypeDefsCtx ctx;
  unordered_map<unsigned_int,_wasm::HeapType,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::HeapType>_>_>
  *implicitTypes_local;
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *types_local;
  IndexMap *typeIndices_local;
  Lexer *input_local;
  ParseDeclsCtx *decls_local;
  
  ctx.sigTypes._M_h._M_single_bucket = (__node_base_ptr)implicitTypes;
  ParseImplicitTypeDefsCtx::ParseImplicitTypeDefsCtx
            ((ParseImplicitTypeDefsCtx *)&__range2,input,types,implicitTypes,typeIndices);
  __end2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin(&decls->implicitTypeDefs)
  ;
  iStack_f8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
                        (&decls->implicitTypeDefs);
  while (bVar2 = __gnu_cxx::operator!=(&__end2,&stack0xffffffffffffff08), bVar2) {
    puVar3 = __gnu_cxx::
             __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
             ::operator*(&__end2);
    with.annotations.
    super__Vector_base<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = *puVar3;
    WithPosition<wasm::WATParser::ParseImplicitTypeDefsCtx>::WithPosition
              ((WithPosition<wasm::WATParser::ParseImplicitTypeDefsCtx> *)local_128,
               (ParseImplicitTypeDefsCtx *)&__range2,
               with.annotations.
               super__Vector_base<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
    typeuse<wasm::WATParser::ParseImplicitTypeDefsCtx>
              ((Result<wasm::Ok> *)&err,(ParseImplicitTypeDefsCtx *)&__range2,true);
    local_168 = Result<wasm::Ok>::getErr((Result<wasm::Ok> *)&err);
    bVar2 = local_168 != (Err *)0x0;
    if (bVar2) {
      wasm::Err::Err((Err *)&i,local_168);
      Result<wasm::Ok>::Result(__return_storage_ptr__,(Err *)&i);
      wasm::Err::~Err((Err *)&i);
    }
    local_18c = (uint)bVar2;
    Result<wasm::Ok>::~Result((Result<wasm::Ok> *)&err);
    if (local_18c == 0) {
      local_18c = 0;
    }
    WithPosition<wasm::WATParser::ParseImplicitTypeDefsCtx>::~WithPosition
              ((WithPosition<wasm::WATParser::ParseImplicitTypeDefsCtx> *)local_128);
    if (local_18c != 0) goto LAB_0240ba79;
    __gnu_cxx::
    __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::
    operator++(&__end2);
  }
  for (local_190 = 0; uVar4 = (ulong)local_190,
      sVar5 = std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::size(types),
      uVar4 < sVar5; local_190 = local_190 + 1) {
    pMVar1 = decls->wasm;
    __x = std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::operator[]
                    (types,(ulong)local_190);
    std::pair<const_wasm::HeapType,_unsigned_int>::pair<wasm::HeapType_&,_unsigned_int_&,_true>
              (&local_1a0,__x,&local_190);
    pVar6 = std::
            unordered_map<wasm::HeapType,_unsigned_int,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_int>_>_>
            ::insert(&pMVar1->typeIndices,&local_1a0);
    local_1b0._M_cur =
         (__node_type *)
         pVar6.first.super__Node_iterator_base<std::pair<const_wasm::HeapType,_unsigned_int>,_true>.
         _M_cur;
    local_1a8 = pVar6.second;
  }
  Result<wasm::Ok>::Result<wasm::Ok>(__return_storage_ptr__,&local_1b1);
  local_18c = 1;
LAB_0240ba79:
  ParseImplicitTypeDefsCtx::~ParseImplicitTypeDefsCtx((ParseImplicitTypeDefsCtx *)&__range2);
  return __return_storage_ptr__;
}

Assistant:

Result<>
parseImplicitTypeDefs(ParseDeclsCtx& decls,
                      Lexer& input,
                      IndexMap& typeIndices,
                      std::vector<HeapType>& types,
                      std::unordered_map<Index, HeapType>& implicitTypes) {
  ParseImplicitTypeDefsCtx ctx(input, types, implicitTypes, typeIndices);
  for (Index pos : decls.implicitTypeDefs) {
    WithPosition with(ctx, pos);
    CHECK_ERR(typeuse(ctx));
  }
  // Record type indices now that all the types have been parsed.
  for (Index i = 0; i < types.size(); ++i) {
    decls.wasm.typeIndices.insert({types[i], i});
  }
  return Ok{};
}